

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1f38a46::LowBDConvolveHorizRSTest_DISABLED_Speed_Test::TestBody
          (LowBDConvolveHorizRSTest_DISABLED_Speed_Test *this)

{
  TestImage<unsigned_char> *this_00;
  ostream *poVar1;
  void **val2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  SEARCH_METHODS *pSVar2;
  int iVar3;
  bool bVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  AssertHelper local_98;
  AssertionResult gtest_ar_1;
  int64_t ref_time;
  int64_t tst_time;
  ACMRandom rnd;
  aom_usec_timer tst_timer;
  aom_usec_timer ref_timer;
  
  this_00 = (TestImage<unsigned_char> *)operator_new(0x50);
  val2 = (void **)0xd;
  TestImage<unsigned_char>::TestImage
            (this_00,0x81,0x2ff,0xd,0x1fff,
             (this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>.bd_
            );
  (this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>.image_ =
       this_00;
  tst_timer.begin.tv_sec = 0;
  testing::internal::CmpHelperNE<(anonymous_namespace)::TestImage<unsigned_char>*,decltype(nullptr)>
            ((char *)&ref_timer,
             (char *)&(this->super_LowBDConvolveHorizRSTest).
                      super_ConvolveHorizRSTestBase<unsigned_char>.image_,
             (TestImage<unsigned_char> **)&tst_timer,val2);
  if ((char)ref_timer.begin.tv_sec == '\0') {
    testing::Message::Message((Message *)&tst_timer);
    if (ref_timer.begin.tv_usec == 0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = *(SEARCH_METHODS **)ref_timer.begin.tv_usec;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_horz_only_frame_superres_test.cc"
               ,0xe1,(char *)pSVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&tst_timer);
    this_01 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ref_timer.begin.tv_usec;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (tst_timer.begin.tv_sec != 0) {
      (**(code **)(*(long *)tst_timer.begin.tv_sec + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ref_timer.begin.tv_usec);
    rnd.random_.state_ = (Random)0xbaba;
    ConvolveHorizRSTestBase<unsigned_char>::Prep
              ((ConvolveHorizRSTestBase<unsigned_char> *)this,&rnd);
    ::aom_usec_timer_start(&ref_timer);
    iVar3 = 1000;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      (*(this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>.
        super_Test._vptr_Test[6])(this);
    }
    ::aom_usec_timer_mark(&ref_timer);
    ref_time = ::aom_usec_timer_elapsed(&ref_timer);
    ::aom_usec_timer_start(&tst_timer);
    iVar3 = 1000;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      (*(this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>.
        super_Test._vptr_Test[6])(this,0);
    }
    ::aom_usec_timer_mark(&tst_timer);
    tst_time = ::aom_usec_timer_elapsed(&tst_timer);
    poVar1 = std::operator<<((ostream *)&std::cout,"[          ] C time = ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    poVar1 = std::operator<<(poVar1," ms, SIMD time = ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::operator<<(poVar1," ms\n");
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&gtest_ar_1,"ref_time","tst_time",&ref_time,&tst_time);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      std::operator<<((ostream *)(local_a0._M_head_impl + 0x10),
                      "Error: ConvolveHorizRSTest (Speed Test), SIMD slower than C.\n");
      std::operator<<((ostream *)(local_a0._M_head_impl + 0x10),"C time: ");
      std::ostream::_M_insert<long>((long)(local_a0._M_head_impl + 0x10));
      std::operator<<((ostream *)(local_a0._M_head_impl + 0x10)," us\n");
      std::operator<<((ostream *)(local_a0._M_head_impl + 0x10),"SIMD time: ");
      std::ostream::_M_insert<long>((long)(local_a0._M_head_impl + 0x10));
      std::operator<<((ostream *)(local_a0._M_head_impl + 0x10)," us\n");
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_horz_only_frame_superres_test.cc"
                 ,0xf5,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_a0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
    }
    this_01 = &gtest_ar_1.message_;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_01);
  return;
}

Assistant:

TEST_P(LowBDConvolveHorizRSTest, DISABLED_Speed) { SpeedTest(); }